

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O0

void __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
::~MeshTraversalSequencer
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *this)

{
  DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  *in_RDI;
  
  (in_RDI->
  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  )._vptr_TraverserBase = (_func_int **)&PTR__MeshTraversalSequencer_002730d8;
  DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  ::~DepthFirstTraverser(in_RDI);
  PointsSequencer::~PointsSequencer((PointsSequencer *)in_RDI);
  return;
}

Assistant:

MeshTraversalSequencer(const Mesh *mesh,
                         const MeshAttributeIndicesEncodingData *encoding_data)
      : mesh_(mesh), encoding_data_(encoding_data), corner_order_(nullptr) {}